

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessJoiner
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Value *pVVar4;
  element_type *this_00;
  element_type *peVar5;
  int iVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  anon_class_1_0_00000001 local_f62;
  v10 local_f61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f60;
  char *local_f58;
  string local_f50;
  Error local_f30;
  Value local_f08;
  ErrorCode local_ebc;
  Error local_eb8;
  Value local_e90;
  ErrorCode local_e44;
  Error local_e40;
  Value local_e18;
  anon_class_1_0_00000001 local_dca;
  v10 local_dc9;
  v10 *local_dc8;
  size_t local_dc0;
  string local_db8;
  Error local_d98;
  Value local_d70;
  ushort local_d24;
  allocator local_d21;
  undefined1 local_d20 [4];
  uint16_t port_1;
  string local_d00;
  Value local_ce0;
  ErrorCode local_c94;
  Error local_c90;
  Value local_c68;
  ushort local_c1c;
  allocator local_c19;
  undefined1 local_c18 [4];
  uint16_t port;
  ErrorCode local_bf4;
  Error local_bf0;
  Value local_bc8;
  allocator local_b79;
  string local_b78;
  ErrorCode local_b54;
  Error local_b50;
  Value local_b28;
  ErrorCode local_adc;
  Error local_ad8;
  Value local_ab0;
  anon_class_1_0_00000001 local_a62;
  v10 local_a61;
  v10 *local_a60;
  size_t local_a58;
  string local_a50;
  Error local_a30;
  Value local_a08;
  unsigned_long local_9c0;
  uint64_t eui64_1;
  string local_9b0;
  ErrorCode local_98c;
  Error local_988;
  Value local_960;
  anon_class_1_0_00000001 local_912;
  v10 local_911;
  v10 *local_910;
  size_t local_908;
  string local_900;
  Error local_8e0;
  Value local_8b8;
  string local_870 [8];
  string provisioningUrl_1;
  string pskd_1;
  string local_828;
  int local_808;
  ErrorCode local_804;
  Error local_800;
  Value local_7d8;
  ErrorCode local_78c;
  Error local_788;
  Value local_760;
  anon_class_1_0_00000001 local_712;
  v10 local_711;
  v10 *local_710;
  size_t local_708;
  string local_700;
  Error local_6e0;
  Value local_6b8;
  string local_670 [8];
  string provisioningUrl;
  string pskd;
  uint64_t eui64;
  string local_620;
  ErrorCode local_5fc;
  Error local_5f8;
  Value local_5d0;
  ErrorCode local_584;
  Error local_580;
  Value local_558;
  anon_class_1_0_00000001 local_4fa;
  v10 local_4f9;
  v10 *local_4f8;
  size_t local_4f0;
  string local_4e8;
  Error local_4c8;
  Value local_4a0;
  undefined1 local_458 [8];
  CommissionerAppPtr commissioner;
  JoinerType type;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_410 [16];
  v10 *local_400;
  ulong local_3f8;
  v10 *local_3f0;
  size_t sStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3d8 [3];
  undefined1 local_3c0 [16];
  v10 *local_3b0;
  ulong local_3a8;
  v10 *local_3a0;
  size_t sStack_398;
  string *local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_388 [3];
  undefined1 local_370 [16];
  v10 *local_360;
  ulong local_358;
  v10 *local_350;
  size_t sStack_348;
  string *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_338 [3];
  undefined1 local_320 [16];
  v10 *local_310;
  ulong local_308;
  v10 *local_300;
  size_t sStack_2f8;
  string *local_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_2e8 [3];
  undefined1 local_2d0 [16];
  v10 *local_2c0;
  ulong local_2b8;
  v10 *local_2b0;
  size_t sStack_2a8;
  string *local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_298 [3];
  undefined1 local_280 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  char *local_268;
  const_reference local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *pcStack_250;
  string *local_248;
  v10 *local_240;
  v10 **local_238;
  v10 *local_230;
  v10 **local_228;
  v10 *local_220;
  v10 **local_218;
  v10 *local_210;
  v10 **local_208;
  v10 *local_200;
  v10 **local_1f8;
  v10 *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1e8;
  v10 **local_1e0;
  v10 *local_1d8;
  size_t sStack_1d0;
  v10 **local_1c0;
  v10 *local_1b8;
  size_t sStack_1b0;
  v10 **local_1a0;
  v10 *local_198;
  size_t sStack_190;
  v10 **local_180;
  v10 *local_178;
  size_t sStack_170;
  v10 **local_160;
  v10 *local_158;
  size_t sStack_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_140;
  undefined1 *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined1 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_110;
  undefined1 *local_108;
  Value **local_100;
  undefined1 *local_f8;
  Value **local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  Value **local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  undefined8 local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_458,(nullptr_t)0x0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  if (sVar2 < 3) {
    ProcessJoiner::anon_class_1_0_00000001::operator()(&local_4fa);
    local_238 = &local_4f8;
    local_240 = &local_4f9;
    bVar7 = ::fmt::v10::operator()(local_240);
    local_4f0 = bVar7.size_;
    local_4f8 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_2a0 = &local_4e8;
    local_2b0 = local_4f8;
    sStack_2a8 = local_4f0;
    local_1e0 = &local_2b0;
    local_2c0 = local_4f8;
    local_2b8 = local_4f0;
    local_1d8 = local_2c0;
    sStack_1d0 = local_2b8;
    local_2e8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_138 = local_2d0;
    local_140 = local_2e8;
    local_60 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_140;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_2b8;
    local_d0 = local_140;
    local_68 = local_140;
    local_58 = local_138;
    ::fmt::v10::vformat_abi_cxx11_(&local_4e8,local_2c0,fmt,args);
    Error::Error(&local_4c8,kInvalidArgs,&local_4e8);
    Value::Value(&local_4a0,&local_4c8);
    Value::operator=(__return_storage_ptr__,&local_4a0);
    Value::~Value(&local_4a0);
    Error::~Error(&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](aExpr,2);
    GetJoinerType(&local_580,
                  (JoinerType *)
                  &commissioner.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,pvVar3);
    Value::Value(&local_558,&local_580);
    pVVar4 = Value::operator=(__return_storage_ptr__,&local_558);
    local_584 = kNone;
    bVar1 = Value::operator!=(pVVar4,&local_584);
    Value::~Value(&local_558);
    Error::~Error(&local_580);
    if (!bVar1) {
      this_00 = std::
                __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mJobManager);
      JobManager::GetSelectedCommissioner(&local_5f8,this_00,(CommissionerAppPtr *)local_458);
      Value::Value(&local_5d0,&local_5f8);
      pVVar4 = Value::operator=(__return_storage_ptr__,&local_5d0);
      local_5fc = kNone;
      bVar1 = Value::operator!=(pVVar4,&local_5fc);
      Value::~Value(&local_5d0);
      Error::~Error(&local_5f8);
      if (!bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_620,"enable",(allocator *)((long)&eui64 + 7));
        bVar1 = CaseInsensitiveEqual(pvVar3,&local_620);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator((allocator<char> *)((long)&eui64 + 7));
        if (bVar1) {
          std::__cxx11::string::string((string *)(provisioningUrl.field_2._M_local_buf + 8));
          std::__cxx11::string::string(local_670);
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(aExpr);
          iVar6 = 4;
          if ((uint)commissioner.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi == 0) {
            iVar6 = 5;
          }
          if (sVar2 < (ulong)(long)iVar6) {
            ProcessJoiner::anon_class_1_0_00000001::operator()(&local_712);
            local_228 = &local_710;
            local_230 = &local_711;
            bVar7 = ::fmt::v10::operator()(local_230);
            local_708 = bVar7.size_;
            local_710 = (v10 *)bVar7.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_2f0 = &local_700;
            local_300 = local_710;
            sStack_2f8 = local_708;
            local_1c0 = &local_300;
            local_310 = local_710;
            local_308 = local_708;
            local_1b8 = local_310;
            sStack_1b0 = local_308;
            local_338[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_128 = local_320;
            local_130 = local_338;
            local_78 = 0;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_130;
            fmt_00.size_ = 0;
            fmt_00.data_ = (char *)local_308;
            local_d8 = local_130;
            local_80 = local_130;
            local_70 = local_128;
            ::fmt::v10::vformat_abi_cxx11_(&local_700,local_310,fmt_00,args_00);
            Error::Error(&local_6e0,kInvalidArgs,&local_700);
            Value::Value(&local_6b8,&local_6e0);
            Value::operator=(__return_storage_ptr__,&local_6b8);
            Value::~Value(&local_6b8);
            Error::~Error(&local_6e0);
            std::__cxx11::string::~string((string *)&local_700);
            local_808 = 4;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,3);
            utils::ParseInteger<unsigned_long>
                      (&local_788,(unsigned_long *)(pskd.field_2._M_local_buf + 8),pvVar3);
            Value::Value(&local_760,&local_788);
            pVVar4 = Value::operator=(__return_storage_ptr__,&local_760);
            local_78c = kNone;
            bVar1 = Value::operator!=(pVVar4,&local_78c);
            Value::~Value(&local_760);
            Error::~Error(&local_788);
            if (bVar1) {
              local_808 = 4;
            }
            else {
              if ((uint)commissioner.
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == 0) {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,4);
                std::__cxx11::string::operator=
                          ((string *)(provisioningUrl.field_2._M_local_buf + 8),(string *)pvVar3);
                sVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(aExpr);
                if (5 < sVar2) {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](aExpr,5);
                  std::__cxx11::string::operator=(local_670,(string *)pvVar3);
                }
              }
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_458);
              (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
                        (&local_800,peVar5,
                         (ulong)(uint)commissioner.
                                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi,pskd.field_2._8_8_,
                         (undefined1 *)((long)&provisioningUrl.field_2 + 8),local_670);
              Value::Value(&local_7d8,&local_800);
              pVVar4 = Value::operator=(__return_storage_ptr__,&local_7d8);
              local_804 = kNone;
              bVar1 = Value::operator!=(pVVar4,&local_804);
              Value::~Value(&local_7d8);
              Error::~Error(&local_800);
              if (bVar1) {
                local_808 = 4;
              }
              else {
                local_808 = 0;
              }
            }
          }
          std::__cxx11::string::~string(local_670);
          std::__cxx11::string::~string((string *)(provisioningUrl.field_2._M_local_buf + 8));
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_828,"enableall",
                     (allocator *)(pskd_1.field_2._M_local_buf + 0xf));
          bVar1 = CaseInsensitiveEqual(pvVar3,&local_828);
          std::__cxx11::string::~string((string *)&local_828);
          std::allocator<char>::~allocator((allocator<char> *)(pskd_1.field_2._M_local_buf + 0xf));
          if (!bVar1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_9b0,"disable",(allocator *)((long)&eui64_1 + 7));
            bVar1 = CaseInsensitiveEqual(pvVar3,&local_9b0);
            std::__cxx11::string::~string((string *)&local_9b0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&eui64_1 + 7));
            if (bVar1) {
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(aExpr);
              if (sVar2 < 4) {
                ProcessJoiner::anon_class_1_0_00000001::operator()(&local_a62);
                local_208 = &local_a60;
                local_210 = &local_a61;
                bVar7 = ::fmt::v10::operator()(local_210);
                local_a58 = bVar7.size_;
                local_a60 = (v10 *)bVar7.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_390 = &local_a50;
                local_3a0 = local_a60;
                sStack_398 = local_a58;
                local_180 = &local_3a0;
                local_3b0 = local_a60;
                local_3a8 = local_a58;
                local_178 = local_3b0;
                sStack_170 = local_3a8;
                local_3d8[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_108 = local_3c0;
                local_110 = local_3d8;
                local_a8 = 0;
                args_02.field_1.values_ = in_R9.values_;
                args_02.desc_ = (unsigned_long_long)local_110;
                fmt_02.size_ = 0;
                fmt_02.data_ = (char *)local_3a8;
                local_e8 = local_110;
                local_b0 = local_110;
                local_a0 = local_108;
                ::fmt::v10::vformat_abi_cxx11_(&local_a50,local_3b0,fmt_02,args_02);
                Error::Error(&local_a30,kInvalidArgs,&local_a50);
                Value::Value(&local_a08,&local_a30);
                Value::operator=(__return_storage_ptr__,&local_a08);
                Value::~Value(&local_a08);
                Error::~Error(&local_a30);
                std::__cxx11::string::~string((string *)&local_a50);
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,3);
                utils::ParseInteger<unsigned_long>(&local_ad8,&local_9c0,pvVar3);
                Value::Value(&local_ab0,&local_ad8);
                pVVar4 = Value::operator=(__return_storage_ptr__,&local_ab0);
                local_adc = kNone;
                bVar1 = Value::operator!=(pVVar4,&local_adc);
                Value::~Value(&local_ab0);
                Error::~Error(&local_ad8);
                if (!bVar1) {
                  peVar5 = std::
                           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_458);
                  (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x16])
                            (&local_b50,peVar5,
                             (ulong)(uint)commissioner.
                                          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi,local_9c0);
                  Value::Value(&local_b28,&local_b50);
                  pVVar4 = Value::operator=(__return_storage_ptr__,&local_b28);
                  local_b54 = kNone;
                  Value::operator!=(pVVar4,&local_b54);
                  Value::~Value(&local_b28);
                  Error::~Error(&local_b50);
                }
              }
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_b78,"disableall",&local_b79);
              bVar1 = CaseInsensitiveEqual(pvVar3,&local_b78);
              std::__cxx11::string::~string((string *)&local_b78);
              std::allocator<char>::~allocator((allocator<char> *)&local_b79);
              if (bVar1) {
                peVar5 = std::
                         __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_458);
                (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x18])
                          (&local_bf0,peVar5,
                           (ulong)(uint)commissioner.
                                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
                Value::Value(&local_bc8,&local_bf0);
                pVVar4 = Value::operator=(__return_storage_ptr__,&local_bc8);
                local_bf4 = kNone;
                Value::operator!=(pVVar4,&local_bf4);
                Value::~Value(&local_bc8);
                Error::~Error(&local_bf0);
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)local_c18,"getport",&local_c19);
                bVar1 = CaseInsensitiveEqual(pvVar3,(string *)local_c18);
                std::__cxx11::string::~string((string *)local_c18);
                std::allocator<char>::~allocator((allocator<char> *)&local_c19);
                if (bVar1) {
                  peVar5 = std::
                           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_458);
                  (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x19])
                            (&local_c90,peVar5,&local_c1c,
                             (ulong)(uint)commissioner.
                                          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
                  Value::Value(&local_c68,&local_c90);
                  pVVar4 = Value::operator=(__return_storage_ptr__,&local_c68);
                  local_c94 = kNone;
                  bVar1 = Value::operator!=(pVVar4,&local_c94);
                  Value::~Value(&local_c68);
                  Error::~Error(&local_c90);
                  if (!bVar1) {
                    std::__cxx11::to_string(&local_d00,(uint)local_c1c);
                    Value::Value(&local_ce0,&local_d00);
                    Value::operator=(__return_storage_ptr__,&local_ce0);
                    Value::~Value(&local_ce0);
                    std::__cxx11::string::~string((string *)&local_d00);
                  }
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](aExpr,1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)local_d20,"setport",&local_d21);
                  bVar1 = CaseInsensitiveEqual(pvVar3,(string *)local_d20);
                  std::__cxx11::string::~string((string *)local_d20);
                  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
                  if (bVar1) {
                    sVar2 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(aExpr);
                    if (sVar2 < 4) {
                      ProcessJoiner::anon_class_1_0_00000001::operator()(&local_dca);
                      local_1f8 = &local_dc8;
                      local_200 = &local_dc9;
                      bVar7 = ::fmt::v10::operator()(local_200);
                      local_dc0 = bVar7.size_;
                      local_dc8 = (v10 *)bVar7.data_;
                      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                      local_3e0 = &local_db8;
                      local_3f0 = local_dc8;
                      sStack_3e8 = local_dc0;
                      local_160 = &local_3f0;
                      local_400 = local_dc8;
                      local_3f8 = local_dc0;
                      local_158 = local_400;
                      sStack_150 = local_3f8;
                      value = (Value *)::fmt::v10::
                                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                                 ();
                      local_f8 = local_410;
                      local_100 = &value;
                      local_c0 = 0;
                      args_03.field_1.values_ = in_R9.values_;
                      args_03.desc_ = (unsigned_long_long)local_100;
                      fmt_03.size_ = 0;
                      fmt_03.data_ = (char *)local_3f8;
                      local_f0 = local_100;
                      local_c8 = local_100;
                      local_b8 = local_f8;
                      ::fmt::v10::vformat_abi_cxx11_(&local_db8,local_400,fmt_03,args_03);
                      Error::Error(&local_d98,kInvalidArgs,&local_db8);
                      Value::Value(&local_d70,&local_d98);
                      Value::operator=(__return_storage_ptr__,&local_d70);
                      Value::~Value(&local_d70);
                      Error::~Error(&local_d98);
                      std::__cxx11::string::~string((string *)&local_db8);
                    }
                    else {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](aExpr,3);
                      utils::ParseInteger<unsigned_short>(&local_e40,&local_d24,pvVar3);
                      Value::Value(&local_e18,&local_e40);
                      pVVar4 = Value::operator=(__return_storage_ptr__,&local_e18);
                      local_e44 = kNone;
                      bVar1 = Value::operator!=(pVVar4,&local_e44);
                      Value::~Value(&local_e18);
                      Error::~Error(&local_e40);
                      if (!bVar1) {
                        peVar5 = std::
                                 __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)local_458);
                        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1a])
                                  (&local_eb8,peVar5,
                                   (ulong)(uint)commissioner.
                                                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi,(ulong)local_d24);
                        Value::Value(&local_e90,&local_eb8);
                        pVVar4 = Value::operator=(__return_storage_ptr__,&local_e90);
                        local_ebc = kNone;
                        Value::operator!=(pVVar4,&local_ebc);
                        Value::~Value(&local_e90);
                        Error::~Error(&local_eb8);
                      }
                    }
                  }
                  else {
                    ProcessJoiner::anon_class_1_0_00000001::operator()(&local_f62);
                    local_1e8 = &local_f60;
                    local_1f0 = &local_f61;
                    bVar7 = ::fmt::v10::operator()(local_1f0);
                    local_f58 = (char *)bVar7.size_;
                    local_f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )bVar7.data_;
                    ::fmt::v10::detail::
                    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                              ();
                    local_260 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](aExpr,1);
                    local_248 = &local_f50;
                    local_258 = local_f60;
                    pcStack_250 = local_f58;
                    local_50 = &local_258;
                    local_270 = local_f60;
                    local_268 = local_f58;
                    local_48 = local_270;
                    pcStack_40 = local_268;
                    local_298[0] = ::fmt::v10::
                                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_260,(v10 *)local_248,local_f60);
                    local_30 = local_280;
                    local_38 = local_298;
                    local_20 = 0xd;
                    args_04.field_1.values_ = in_R9.values_;
                    args_04.desc_ = (unsigned_long_long)local_38;
                    fmt_04.size_ = 0xd;
                    fmt_04.data_ = local_268;
                    local_28 = local_38;
                    local_18 = local_30;
                    local_10 = local_38;
                    ::fmt::v10::vformat_abi_cxx11_(&local_f50,(v10 *)local_270,fmt_04,args_04);
                    Error::Error(&local_f30,kInvalidCommand,&local_f50);
                    Value::Value(&local_f08,&local_f30);
                    Value::operator=(__return_storage_ptr__,&local_f08);
                    Value::~Value(&local_f08);
                    Error::~Error(&local_f30);
                    std::__cxx11::string::~string((string *)&local_f50);
                  }
                }
              }
            }
            goto LAB_00133331;
          }
          std::__cxx11::string::string((string *)(provisioningUrl_1.field_2._M_local_buf + 8));
          std::__cxx11::string::string(local_870);
          if ((uint)commissioner.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi == 0) {
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(aExpr);
            if (3 < sVar2) {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,3);
              std::__cxx11::string::operator=
                        ((string *)(provisioningUrl_1.field_2._M_local_buf + 8),(string *)pvVar3);
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(aExpr);
              if (4 < sVar2) {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,4);
                std::__cxx11::string::operator=(local_870,(string *)pvVar3);
              }
              goto LAB_001321c2;
            }
            ProcessJoiner::anon_class_1_0_00000001::operator()(&local_912);
            local_218 = &local_910;
            local_220 = &local_911;
            bVar7 = ::fmt::v10::operator()(local_220);
            local_908 = bVar7.size_;
            local_910 = (v10 *)bVar7.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_340 = &local_900;
            local_350 = local_910;
            sStack_348 = local_908;
            local_1a0 = &local_350;
            local_360 = local_910;
            local_358 = local_908;
            local_198 = local_360;
            sStack_190 = local_358;
            local_388[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_118 = local_370;
            local_120 = local_388;
            local_90 = 0;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_120;
            fmt_01.size_ = 0;
            fmt_01.data_ = (char *)local_358;
            local_e0 = local_120;
            local_98 = local_120;
            local_88 = local_118;
            ::fmt::v10::vformat_abi_cxx11_(&local_900,local_360,fmt_01,args_01);
            Error::Error(&local_8e0,kInvalidArgs,&local_900);
            Value::Value(&local_8b8,&local_8e0);
            Value::operator=(__return_storage_ptr__,&local_8b8);
            Value::~Value(&local_8b8);
            Error::~Error(&local_8e0);
            std::__cxx11::string::~string((string *)&local_900);
            local_808 = 4;
          }
          else {
LAB_001321c2:
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_458);
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x17])
                      (&local_988,peVar5,
                       (ulong)(uint)commissioner.
                                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi,
                       (undefined1 *)((long)&provisioningUrl_1.field_2 + 8),local_870);
            Value::Value(&local_960,&local_988);
            pVVar4 = Value::operator=(__return_storage_ptr__,&local_960);
            local_98c = kNone;
            bVar1 = Value::operator!=(pVVar4,&local_98c);
            Value::~Value(&local_960);
            Error::~Error(&local_988);
            if (bVar1) {
              local_808 = 4;
            }
            else {
              local_808 = 0;
            }
          }
          std::__cxx11::string::~string(local_870);
          std::__cxx11::string::~string((string *)(provisioningUrl_1.field_2._M_local_buf + 8));
        }
        if ((local_808 != 0) && (local_808 != 4)) goto LAB_00133342;
      }
    }
  }
LAB_00133331:
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  local_808 = 1;
LAB_00133342:
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_458);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessJoiner(const Expression &aExpr)
{
    Value              value;
    JoinerType         type;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = GetJoinerType(type, aExpr[2]));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    if (CaseInsensitiveEqual(aExpr[1], "enable"))
    {
        uint64_t    eui64;
        std::string pskd;
        std::string provisioningUrl;

        VerifyOrExit(aExpr.size() >= (type == JoinerType::kMeshCoP ? 5 : 4),
                     value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        if (type == JoinerType::kMeshCoP)
        {
            pskd = aExpr[4];
            if (aExpr.size() >= 6)
            {
                provisioningUrl = aExpr[5];
            }
        }

        SuccessOrExit(value = commissioner->EnableJoiner(type, eui64, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "enableall"))
    {
        std::string pskd;
        std::string provisioningUrl;
        if (type == JoinerType::kMeshCoP)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            pskd = aExpr[3];
            if (aExpr.size() >= 5)
            {
                provisioningUrl = aExpr[4];
            }
        }

        SuccessOrExit(value = commissioner->EnableAllJoiners(type, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disable"))
    {
        uint64_t eui64;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        SuccessOrExit(value = commissioner->DisableJoiner(type, eui64));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disableall"))
    {
        SuccessOrExit(value = commissioner->DisableAllJoiners(type));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "getport"))
    {
        uint16_t port;
        SuccessOrExit(value = commissioner->GetJoinerUdpPort(port, type));
        value = std::to_string(port);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "setport"))
    {
        uint16_t port;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(port, aExpr[3]));
        SuccessOrExit(value = commissioner->SetJoinerUdpPort(type, port));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}